

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer>::
WriteArgs<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>>
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,
          ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> begin,
          ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> end,char *sep,
          int precedence)

{
  BasicStringRef<char> value;
  bool bVar1;
  ExprBase EVar2;
  undefined8 in_RCX;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> in_RDX;
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *in_RDI;
  Buffer<char> *in_stack_ffffffffffffff98;
  ExprBase other;
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this_00;
  ExprBase e;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_8;
  
  this_00 = in_RDI;
  fmt::BasicWriter<char>::operator<<
            ((BasicWriter<char> *)in_RDI,(char)((ulong)in_stack_ffffffffffffff98 >> 0x38));
  other.impl_ = (Impl *)in_RDX.ptr_;
  bVar1 = internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::operator!=
                    (&local_8,in_RDX);
  if (bVar1) {
    EVar2.impl_ = (Impl *)internal::
                          ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::
                          operator*((ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>
                                     *)in_stack_ffffffffffffff98);
    ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Visit
              (this_00,(LogicalExpr)other.impl_,(int)((ulong)in_RCX >> 0x20));
    internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::operator++
              (&local_8);
    while (e.impl_ = other.impl_,
          bVar1 = internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::
                  operator!=(&local_8,(ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>
                                       )other.impl_), bVar1) {
      in_stack_ffffffffffffff98 = (Buffer<char> *)in_RDI->writer_;
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)in_RDI,(char *)in_stack_ffffffffffffff98);
      value.size_ = (size_t)in_RDX.ptr_;
      value.data_ = (char *)EVar2.impl_;
      fmt::BasicWriter<char>::operator<<((BasicWriter<char> *)other.impl_,value);
      internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::operator*
                ((ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)
                 in_stack_ffffffffffffff98);
      ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Visit
                (this_00,(LogicalExpr)e.impl_,(int)((ulong)in_RCX >> 0x20));
      internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::operator++
                (&local_8);
      other.impl_ = e.impl_;
    }
  }
  fmt::BasicWriter<char>::operator<<
            ((BasicWriter<char> *)in_RDI,(char)((ulong)in_stack_ffffffffffffff98 >> 0x38));
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteArgs(
    Iter begin, Iter end, const char *sep, int precedence) {
  writer_ << '(';
  if (begin != end) {
    Visit(*begin, precedence);
    for (++begin; begin != end; ++begin) {
      writer_ << sep;
      Visit(*begin, precedence);
    }
  }
  writer_ << ')';
}